

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::YoloDetectionOutput::forward_inplace
          (YoloDetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs
          ,Option *opt)

{
  value_type vVar1;
  ulong uVar2;
  size_type sVar3;
  Mat *pMVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  float *pfVar8;
  undefined8 in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar9;
  float fVar10;
  float fVar11;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> *box_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int p;
  int pp;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_box_bbox_rects;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blob;
  size_t b;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  Mat *m_6;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_5;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff458;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  *in_stack_fffffffffffff460;
  undefined7 in_stack_fffffffffffff468;
  undefined1 in_stack_fffffffffffff46f;
  reference in_stack_fffffffffffff470;
  reference pvVar12;
  int in_stack_fffffffffffff478;
  int in_stack_fffffffffffff47c;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *in_stack_fffffffffffff480;
  Mat *this_00;
  vector<float,_std::allocator<float>_> *this_01;
  iterator in_stack_fffffffffffff4a8;
  __normal_iterator<const_ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
  in_stack_fffffffffffff4b0;
  const_iterator in_stack_fffffffffffff4b8;
  float in_stack_fffffffffffff504;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff508;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *in_stack_fffffffffffff510;
  int local_9d4;
  Mat *local_9b8;
  vector<float,_std::allocator<float>_> local_9b0;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_998;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_980;
  float *local_968;
  float *local_960;
  float *local_958;
  float *local_950;
  BBoxRect *local_940;
  BBoxRect *local_938;
  BBoxRect *local_930;
  BBoxRect *local_928;
  reference local_918;
  reference local_910;
  int local_904;
  float local_900;
  float local_8fc;
  float local_8f8;
  float local_8f4;
  int local_8f0;
  float local_8ec;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  Allocator *local_8c8;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined8 local_8a8;
  float local_89c;
  int local_898;
  float local_894;
  int local_890;
  float local_88c;
  float local_888;
  float local_884;
  float local_880;
  float local_87c;
  float local_878;
  float local_874;
  float local_870;
  float local_86c;
  int local_868;
  int local_864;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> local_860;
  int local_848;
  Allocator *local_840;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  undefined4 local_828;
  ulong local_820;
  undefined8 local_818;
  undefined8 local_810;
  undefined8 local_808;
  undefined4 local_800;
  Allocator *local_7f8;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined8 local_7d8;
  void *local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined4 local_7b0;
  Allocator *local_7a8;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined8 local_788;
  float *local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_768;
  undefined4 local_760;
  Allocator *local_758;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined4 local_744;
  undefined4 local_740;
  undefined8 local_738;
  float *local_730;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined4 local_710;
  Allocator *local_708;
  undefined4 local_700;
  undefined4 local_6fc;
  undefined4 local_6f8;
  undefined4 local_6f4;
  undefined4 local_6f0;
  undefined8 local_6e8;
  void *local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined8 local_6c8;
  undefined4 local_6c0;
  Allocator *local_6b8;
  undefined4 local_6b0;
  undefined4 local_6ac;
  undefined4 local_6a8;
  undefined4 local_6a4;
  undefined4 local_6a0;
  undefined8 local_698;
  void *local_690;
  float local_684;
  float local_680;
  int local_67c;
  int local_678;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_668;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_650;
  undefined4 local_634;
  int local_630;
  int local_62c;
  int local_628;
  int local_624;
  reference local_620;
  ulong local_618;
  vector<float,_std::allocator<float>_> local_610;
  vector<float,_std::allocator<float>_> local_5f8;
  undefined8 local_5e0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_5d8;
  int local_5c4;
  undefined8 *local_5c0;
  undefined8 *local_5b0;
  undefined8 *local_5a0;
  undefined8 *local_590;
  undefined8 *local_580;
  undefined8 *local_570;
  BBoxRect *local_560;
  long local_550;
  long *local_548;
  long local_540;
  long *local_538;
  undefined1 local_52d;
  int local_52c;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_528;
  undefined8 *local_520;
  undefined1 local_50d;
  int local_50c;
  reference local_508;
  undefined8 *local_500;
  undefined1 local_4ed;
  int local_4ec;
  reference local_4e8;
  undefined8 *local_4e0;
  undefined1 local_4cd;
  int local_4cc;
  reference local_4c8;
  undefined8 *local_4c0;
  undefined1 local_4ad;
  int local_4ac;
  reference local_4a8;
  undefined8 *local_4a0;
  undefined1 local_48d;
  int local_48c;
  reference local_488;
  undefined8 *local_480;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined1 local_441;
  undefined4 local_440;
  int local_43c;
  reference local_438;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_430;
  int local_41c;
  reference local_418;
  int local_40c;
  undefined8 *local_408;
  reference local_400;
  float local_378;
  undefined4 local_374;
  BBoxRect *local_370;
  undefined8 *local_350;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  pointer local_248;
  Allocator *local_200;
  int local_1f4;
  size_t local_1f0;
  void *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  float *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  float *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  void *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  pointer local_d8;
  float *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  Allocator *local_50;
  int local_44;
  pointer local_40;
  pointer local_38;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *local_20;
  undefined4 local_14;
  long local_10;
  reference local_8;
  
  local_5e0 = in_RDX;
  local_5d8 = in_RSI;
  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x148f21c);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x148f229);
  local_618 = 0;
  do {
    uVar2 = local_618;
    sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_5d8);
    if (sVar3 <= uVar2) {
      qsort_descent_inplace<ncnn::BBoxRect>
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff470,
                 (vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1491a6a);
      nms_sorted_bboxes(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                        in_stack_fffffffffffff504);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)0x1491a9b);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1491aa8);
      local_9b8 = (Mat *)0x0;
      pvVar12 = in_stack_fffffffffffff470;
      while (this_00 = local_9b8,
            pMVar4 = (Mat *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                      (&local_980), this_00 < pMVar4) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_980,(size_type)local_9b8);
        sVar3 = *pvVar5;
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_5f8,sVar3);
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)pvVar12,
                   (value_type *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
        std::vector<float,_std::allocator<float>_>::operator[](&local_610,sVar3);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)pvVar12,
                   (value_type_conflict4 *)
                   CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
        local_9b8 = (Mat *)((long)&local_9b8->data + 1);
      }
      sVar3 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::size(&local_998);
      if ((int)sVar3 == 0) {
        local_5c4 = 0;
        in_stack_fffffffffffff470 = pvVar12;
      }
      else {
        in_stack_fffffffffffff470 =
             std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_5d8,0);
        Mat::create(this_00,in_stack_fffffffffffff47c,in_stack_fffffffffffff478,(size_t)pvVar12,
                    (Allocator *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
        bVar9 = true;
        if (in_stack_fffffffffffff470->data != (void *)0x0) {
          bVar9 = in_stack_fffffffffffff470->cstep * (long)in_stack_fffffffffffff470->c == 0;
          local_8 = in_stack_fffffffffffff470;
        }
        local_400 = in_stack_fffffffffffff470;
        if (bVar9) {
          local_5c4 = -100;
        }
        else {
          pvVar12 = in_stack_fffffffffffff470;
          for (local_9d4 = 0; local_9d4 < (int)sVar3; local_9d4 = local_9d4 + 1) {
            pvVar6 = std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::operator[]
                               (&local_998,(long)local_9d4);
            pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_9b0,(long)local_9d4);
            vVar1 = *pvVar7;
            local_41c = local_9d4;
            pfVar8 = (float *)((long)in_stack_fffffffffffff470->data +
                              (long)in_stack_fffffffffffff470->w * (long)local_9d4 *
                              in_stack_fffffffffffff470->elemsize);
            *pfVar8 = (float)pvVar6->label + 1.0;
            pfVar8[1] = vVar1;
            pfVar8[2] = pvVar6->xmin;
            pfVar8[3] = pvVar6->ymin;
            pfVar8[4] = pvVar6->xmax;
            pfVar8[5] = pvVar6->ymax;
            local_418 = in_stack_fffffffffffff470;
          }
          local_5c4 = 0;
          in_stack_fffffffffffff470 = pvVar12;
        }
      }
      local_634 = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff470);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff470);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff470)
      ;
LAB_01491e84:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff470);
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~vector
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                 in_stack_fffffffffffff470);
      return local_5c4;
    }
    local_620 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_5d8,local_618);
    local_624 = local_620->w;
    local_628 = local_620->h;
    local_62c = local_620->c;
    local_630 = local_62c / *(int *)(in_RDI + 0xd4);
    if (local_630 != *(int *)(in_RDI + 0xd0) + 5) {
      local_5c4 = -1;
      local_634 = 1;
      goto LAB_01491e84;
    }
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)0x148f31a);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)0x148f327);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)in_stack_fffffffffffff480,
             CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478));
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(in_stack_fffffffffffff480,CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478)
            );
    for (local_678 = 0; local_678 < *(int *)(in_RDI + 0xd4); local_678 = local_678 + 1) {
      local_67c = local_678 * local_630;
      local_538 = (long *)(in_RDI + 0xe0);
      local_540 = (long)(local_678 << 1);
      local_680 = *(float *)(*local_538 + local_540 * 4);
      local_548 = (long *)(in_RDI + 0xe0);
      local_550 = (long)(local_678 * 2 + 1);
      local_684 = *(float *)(*local_548 + local_550 * 4);
      local_480 = &local_6d8;
      local_1d4 = local_620->w;
      local_1d8 = local_620->h;
      local_1dc = local_620->d;
      local_690 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_67c * local_620->elemsize);
      local_1f0 = local_620->elemsize;
      local_1f4 = local_620->elempack;
      local_200 = local_620->allocator;
      local_1d0 = &local_6d8;
      local_58 = (long)local_1d4 * (long)local_1d8 * local_1f0;
      local_450 = &local_6d8;
      local_5c0 = &local_6d8;
      local_4ac = local_67c + 1;
      local_4a0 = &local_728;
      local_19c = local_620->w;
      local_1a0 = local_620->h;
      local_1a4 = local_620->d;
      local_6e0 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_4ac * local_620->elemsize);
      local_1b8 = local_620->elemsize;
      local_1bc = local_620->elempack;
      local_1c8 = local_620->allocator;
      local_198 = &local_728;
      local_68 = (long)local_19c * (long)local_1a0 * local_1b8;
      local_458 = &local_728;
      local_5b0 = &local_728;
      local_4cc = local_67c + 2;
      local_4c0 = &local_778;
      local_164 = local_620->w;
      local_168 = local_620->h;
      local_16c = local_620->d;
      local_730 = (float *)((long)local_620->data +
                           local_620->cstep * (long)local_4cc * local_620->elemsize);
      local_180 = local_620->elemsize;
      local_184 = local_620->elempack;
      local_190 = local_620->allocator;
      local_160 = &local_778;
      local_78 = (long)local_164 * (long)local_168 * local_180;
      local_460 = &local_778;
      local_5a0 = &local_778;
      local_4ec = local_67c + 3;
      local_4e0 = &local_7c8;
      local_12c = local_620->w;
      local_130 = local_620->h;
      local_134 = local_620->d;
      local_780 = (float *)((long)local_620->data +
                           local_620->cstep * (long)local_4ec * local_620->elemsize);
      local_148 = local_620->elemsize;
      local_14c = local_620->elempack;
      local_158 = local_620->allocator;
      local_128 = &local_7c8;
      local_88 = (long)local_12c * (long)local_130 * local_148;
      local_468 = &local_7c8;
      local_590 = &local_7c8;
      local_50c = local_67c + 4;
      local_500 = &local_818;
      local_f4 = local_620->w;
      local_f8 = local_620->h;
      local_fc = local_620->d;
      local_7d0 = (void *)((long)local_620->data +
                          local_620->cstep * (long)local_50c * local_620->elemsize);
      local_110 = local_620->elemsize;
      local_114 = local_620->elempack;
      local_120 = local_620->allocator;
      local_f0 = &local_818;
      local_98 = (long)local_f4 * (long)local_f8 * local_110;
      local_470 = &local_818;
      local_580 = &local_818;
      local_6a0 = 0;
      local_6a4 = 0;
      local_6a8 = 0;
      local_6ac = 0;
      local_6c0 = 0;
      local_6c8 = 0;
      local_6d0 = 0;
      local_6d8 = 0;
      local_6f0 = 0;
      local_6f4 = 0;
      local_6f8 = 0;
      local_6fc = 0;
      local_710 = 0;
      local_718 = 0;
      local_720 = 0;
      local_728 = 0;
      local_740 = 0;
      local_744 = 0;
      local_748 = 0;
      local_74c = 0;
      local_760 = 0;
      local_768 = 0;
      local_770 = 0;
      local_778 = 0;
      local_790 = 0;
      local_794 = 0;
      local_798 = 0;
      local_79c = 0;
      local_7b0 = 0;
      local_7b8 = 0;
      local_7c0 = 0;
      local_7c8 = 0;
      local_5c = 0x10;
      local_6c = 0x10;
      local_7c = 0x10;
      local_8c = 0x10;
      local_9c = 0x10;
      local_488 = local_620;
      local_48d = 1;
      local_4a8 = local_620;
      local_4ad = 1;
      local_4c8 = local_620;
      local_4cd = 1;
      local_4e8 = local_620;
      local_4ed = 1;
      local_508 = local_620;
      local_50d = 1;
      local_698 = 0;
      local_6b0 = 0;
      local_6e8 = 0;
      local_700 = 0;
      local_738 = 0;
      local_750 = 0;
      local_788 = 0;
      local_7a0 = 0;
      local_818 = 0;
      local_808 = 0;
      local_800 = 0;
      local_7ec = 0;
      local_7e8 = 0;
      local_7e4 = 0;
      local_7e0 = 0;
      local_810 = 0;
      local_43c = local_67c + 5;
      local_440 = *(undefined4 *)(in_RDI + 0xd0);
      local_430 = &local_860;
      local_24 = local_620->w;
      local_28 = local_620->h;
      local_2c = local_620->d;
      local_38 = (pointer)((long)local_620->data +
                          local_620->cstep * (long)local_43c * local_620->elemsize);
      local_40 = (pointer)local_620->elemsize;
      local_44 = local_620->elempack;
      local_50 = local_620->allocator;
      in_stack_fffffffffffff510 = &local_860;
      local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_10 = (long)local_24 * (long)local_28 * (long)local_2c * (long)local_40;
      local_820 = (local_10 + 0xfU & 0xfffffffffffffff0) / (ulong)local_40;
      local_838 = local_620->dims;
      local_14 = 0x10;
      local_438 = local_620;
      local_441 = 1;
      local_7d8 = 0;
      local_7f0 = 0;
      local_48c = local_67c;
      local_330 = local_580;
      local_310 = local_590;
      local_2f0 = local_5a0;
      local_2d0 = local_5b0;
      local_2b0 = local_5c0;
      local_1e8 = local_690;
      local_1b0 = local_6e0;
      local_178 = local_730;
      local_140 = local_780;
      local_108 = local_7d0;
      local_30 = local_440;
      local_20 = in_stack_fffffffffffff510;
      local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = local_38;
      local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_40;
      local_848 = local_44;
      local_840 = local_50;
      local_834 = local_24;
      local_830 = local_28;
      local_82c = local_2c;
      local_828 = local_440;
      local_7f8 = local_120;
      local_7a8 = local_158;
      local_758 = local_190;
      local_708 = local_1c8;
      local_6b8 = local_200;
      (**(code **)(**(long **)(in_RDI + 0x128) + 0x48))
                (*(long **)(in_RDI + 0x128),&local_860,local_5e0);
      for (local_864 = 0; local_864 < local_628; local_864 = local_864 + 1) {
        for (local_868 = 0; local_868 < local_624; local_868 = local_868 + 1) {
          fVar10 = (float)local_868;
          in_stack_fffffffffffff504 = sigmoid(0.0);
          local_86c = (fVar10 + in_stack_fffffffffffff504) / (float)local_624;
          fVar10 = (float)local_864;
          fVar11 = sigmoid(0.0);
          local_870 = (fVar10 + fVar11) / (float)local_628;
          fVar10 = expf(*local_730);
          local_874 = (fVar10 * local_680) / (float)local_624;
          fVar10 = expf(*local_780);
          local_878 = (fVar10 * local_684) / (float)local_628;
          local_87c = local_86c - local_874 * 0.5;
          local_880 = local_870 - local_878 * 0.5;
          local_884 = local_86c + local_874 * 0.5;
          local_888 = local_870 + local_878 * 0.5;
          local_88c = sigmoid(0.0);
          local_890 = 0;
          local_894 = 0.0;
          for (local_898 = 0; local_898 < *(int *)(in_RDI + 0xd0); local_898 = local_898 + 1) {
            local_520 = &local_8e8;
            local_528 = &local_860;
            local_d0 = (float *)((long)&(local_860.
                                         super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->xmin +
                                local_820 * (long)local_898 *
                                (long)local_860.
                                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_b8 = &local_8e8;
            local_8c8 = local_840;
            local_a8 = (long)local_834 * (long)local_830 *
                       (long)local_860.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_ac = 0x10;
            local_bc = local_834;
            local_c0 = local_830;
            local_c4 = local_82c;
            local_d8 = local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_dc = local_848;
            local_e8 = local_840;
            local_52c = local_898;
            local_52d = 1;
            local_408 = &local_8e8;
            local_40c = local_864;
            local_89c = *(float *)((long)local_d0 +
                                  (long)local_868 * 4 +
                                  (long)local_834 * (long)local_864 *
                                  (long)local_860.
                                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_570 = &local_8e8;
            local_8e8 = 0;
            local_8d8 = 0;
            local_8d0 = 0;
            local_8c0 = 0;
            local_8bc = 0;
            local_8b8 = 0;
            local_8b4 = 0;
            local_8b0 = 0;
            local_8a8 = 0;
            local_8e0 = 0;
            if (local_894 < local_89c) {
              local_890 = local_898;
              local_894 = local_89c;
            }
            local_350 = local_570;
          }
          local_8ec = local_88c * local_894;
          if (*(float *)(in_RDI + 0xd8) <= local_8ec) {
            local_900 = local_87c;
            local_8fc = local_880;
            local_8f8 = local_884;
            local_8f4 = local_888;
            local_8f0 = local_890;
            std::
            vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
            ::operator[](&local_650,(long)local_678);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       in_stack_fffffffffffff470,
                       (value_type *)CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](&local_668,(long)local_678);
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff470,
                       (value_type_conflict4 *)
                       CONCAT17(in_stack_fffffffffffff46f,in_stack_fffffffffffff468));
          }
          local_690 = (void *)((long)local_690 + 4);
          local_6e0 = (void *)((long)local_6e0 + 4);
          local_730 = local_730 + 1;
          local_780 = local_780 + 1;
          local_7d0 = (void *)((long)local_7d0 + 4);
        }
      }
      in_stack_fffffffffffff4b8._M_current = (BBoxRect *)&local_860;
      local_560 = in_stack_fffffffffffff4b8._M_current;
      local_370 = in_stack_fffffffffffff4b8._M_current;
      if (local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_374 = 0xffffffff;
        LOCK();
        local_378 = (local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->xmin;
        (local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
         super__Vector_impl_data._M_finish)->xmin =
             (float)((int)(local_860.
                           super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                           _M_impl.super__Vector_impl_data._M_finish)->xmin + -1);
        UNLOCK();
        if (local_378 == 1.4013e-45) {
          if (local_840 == (Allocator *)0x0) {
            local_248 = local_860.
                        super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                        super__Vector_impl_data._M_start;
            if (local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                   _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            (*local_840->_vptr_Allocator[3])
                      (local_840,
                       local_860.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      (in_stack_fffffffffffff4b8._M_current)->xmin = 0.0;
      (in_stack_fffffffffffff4b8._M_current)->ymin = 0.0;
      *(pointer *)&(in_stack_fffffffffffff4b8._M_current)->label = (pointer)0x0;
      in_stack_fffffffffffff4b8._M_current[1].ymin = 0.0;
      in_stack_fffffffffffff4b8._M_current[2].xmin = 0.0;
      in_stack_fffffffffffff4b8._M_current[2].ymin = 0.0;
      in_stack_fffffffffffff4b8._M_current[2].xmax = 0.0;
      in_stack_fffffffffffff4b8._M_current[2].ymax = 0.0;
      in_stack_fffffffffffff4b8._M_current[2].label = 0;
      *(pointer *)&in_stack_fffffffffffff4b8._M_current[3].ymin = (pointer)0x0;
      *(pointer *)&(in_stack_fffffffffffff4b8._M_current)->xmax = (pointer)0x0;
    }
    for (local_904 = 0; local_904 < *(int *)(in_RDI + 0xd4); local_904 = local_904 + 1) {
      local_910 = std::
                  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                  ::operator[](&local_650,(long)local_904);
      local_918 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[](&local_668,(long)local_904);
      this_01 = &local_5f8;
      local_928 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff458);
      __gnu_cxx::
      __normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>
      ::__normal_iterator<ncnn::BBoxRect*>
                (in_stack_fffffffffffff460,
                 (__normal_iterator<ncnn::BBoxRect_*,_std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>
                  *)in_stack_fffffffffffff458);
      local_930 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::begin
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff458);
      local_938 = (BBoxRect *)
                  std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::end
                            ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                             in_stack_fffffffffffff458);
      in_stack_fffffffffffff4a8 =
           std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
           insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                     ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)this_01,
                      in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0,
                      in_stack_fffffffffffff4a8._M_current);
      local_940 = in_stack_fffffffffffff4a8._M_current;
      local_950 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffff458);
      __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
      __normal_iterator<float*>
                ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffff460,
                 (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                 in_stack_fffffffffffff458);
      local_958 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                     (in_stack_fffffffffffff458);
      local_960 = (float *)std::vector<float,_std::allocator<float>_>::end
                                     (in_stack_fffffffffffff458);
      local_968 = (float *)std::vector<float,std::allocator<float>>::
                           insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                                     (this_01,(const_iterator)in_stack_fffffffffffff4b8._M_current,
                                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                       )in_stack_fffffffffffff4b0._M_current,
                                      (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                                       )in_stack_fffffffffffff4a8._M_current);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)in_stack_fffffffffffff470);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)in_stack_fffffffffffff470);
    local_618 = local_618 + 1;
  } while( true );
}

Assistant:

int YoloDetectionOutput::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_top_blobs.size(); b++)
    {
        Mat& bottom_top_blob = bottom_top_blobs[b];

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;

        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector<std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;

            const float bias_w = biases[pp * 2];
            const float bias_h = biases[pp * 2 + 1];

            const float* xptr = bottom_top_blob.channel(p);
            const float* yptr = bottom_top_blob.channel(p + 1);
            const float* wptr = bottom_top_blob.channel(p + 2);
            const float* hptr = bottom_top_blob.channel(p + 3);

            const float* box_score_ptr = bottom_top_blob.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blob.channel_range(p + 5, num_class);
            softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // region box
                    float bbox_cx = (j + sigmoid(xptr[0])) / w;
                    float bbox_cy = (i + sigmoid(yptr[0])) / h;
                    float bbox_w = expf(wptr[0]) * bias_w / w;
                    float bbox_h = expf(hptr[0]) * bias_h / h;

                    float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                    float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                    float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                    float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = 0.f;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //                 NCNN_LOGE("%d %f %f", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                        BBoxRect c = {bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = bottom_top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}